

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

UnlocalizedNumberFormatter * __thiscall
icu_63::number::UnlocalizedNumberFormatter::operator=(UnlocalizedNumberFormatter *this,UNF *src)

{
  UNF *src_local;
  UnlocalizedNumberFormatter *this_local;
  
  NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>::operator=
            (&this->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>,
             &src->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>);
  return this;
}

Assistant:

UnlocalizedNumberFormatter& UnlocalizedNumberFormatter::operator=(UNF&& src) U_NOEXCEPT {
    NFS<UNF>::operator=(static_cast<NFS<UNF>&&>(src));
    // No additional fields to assign
    return *this;
}